

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O1

void CS248::Collada::ColladaParser::parse_node(XMLElement *xml)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  XMLElement *pXVar8;
  XMLElement *pXVar9;
  XMLElement *xml_00;
  XMLElement *xml_01;
  LightInfo *pLVar10;
  size_t sVar11;
  MaterialInfo *pMVar12;
  long lVar13;
  int i;
  string *psVar14;
  Matrix4x4 *pMVar15;
  Matrix4x4 *pMVar16;
  stringstream *psVar17;
  Matrix4x4 *pMVar18;
  double *pdVar19;
  undefined8 *puVar20;
  byte bVar21;
  string s_1;
  Matrix4x4 mat;
  string name;
  string sid;
  Node node;
  string s;
  Matrix4x4 transform_save;
  undefined1 *local_528 [2];
  undefined1 local_518 [16];
  Matrix4x4 local_508;
  XMLElement *local_488;
  undefined1 *local_480 [2];
  undefined1 local_470 [16];
  undefined1 *local_460;
  long local_458;
  undefined1 local_450 [16];
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  Node local_300;
  undefined1 *local_238 [2];
  undefined1 local_228 [96];
  undefined8 auStack_1c8 [2];
  stringstream local_1b8 [8];
  undefined8 auStack_1b0 [15];
  ios_base local_138 [264];
  
  bVar21 = 0;
  Node::Node(&local_300);
  pcVar7 = tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
  strlen(pcVar7);
  std::__cxx11::string::_M_replace
            ((ulong)&local_300,0,(char *)local_300.id._M_string_length,(ulong)pcVar7);
  pcVar7 = tinyxml2::XMLElement::Attribute(xml,"name",(char *)0x0);
  strlen(pcVar7);
  std::__cxx11::string::_M_replace
            ((ulong)&local_300.name,0,(char *)local_300.name._M_string_length,(ulong)pcVar7);
  local_488 = xml;
  pXVar8 = tinyxml2::XMLNode::FirstChildElement(&xml->super_XMLNode,(char *)0x0);
  pMVar16 = &local_300.transform;
  do {
    if (pXVar8 == (XMLElement *)0x0) break;
    pcVar7 = tinyxml2::XMLNode::Value(&pXVar8->super_XMLNode);
    std::__cxx11::string::string((string *)local_480,pcVar7,(allocator *)local_1b8);
    iVar5 = std::__cxx11::string::compare((char *)local_480);
    if (iVar5 == 0) {
      pcVar7 = tinyxml2::XMLElement::GetText(pXVar8);
      std::__cxx11::string::string((string *)local_238,pcVar7,(allocator *)local_1b8);
      std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_238,_S_out|_S_in);
      local_508.entries[3].z = 0.0;
      local_508.entries[3].w = 0.0;
      local_508.entries[3].x = 0.0;
      local_508.entries[3].y = 0.0;
      local_508.entries[2].z = 0.0;
      local_508.entries[2].w = 0.0;
      local_508.entries[2].x = 0.0;
      local_508.entries[2].y = 0.0;
      local_508.entries[1].z = 0.0;
      local_508.entries[1].w = 0.0;
      local_508.entries[1].x = 0.0;
      local_508.entries[1].y = 0.0;
      local_508.entries[0].z = 0.0;
      local_508.entries[0].w = 0.0;
      local_508.entries[0].x = 0.0;
      local_508.entries[0].y = 0.0;
      Matrix4x4::operator()(&local_508,0,0);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,0,1);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,0,2);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,0,3);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,1,0);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,1,1);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,1,2);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,1,3);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,2,0);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,2,1);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,2,2);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,2,3);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,3,0);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,3,1);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,3,2);
      std::istream::_M_extract<double>((double *)local_1b8);
      Matrix4x4::operator()(&local_508,3,3);
      std::istream::_M_extract<double>((double *)local_1b8);
      pMVar15 = &local_508;
      pMVar18 = pMVar16;
      for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
        pMVar18->entries[0].x = pMVar15->entries[0].x;
        pMVar15 = (Matrix4x4 *)((long)pMVar15 + ((ulong)bVar21 * -2 + 1) * 8);
        pMVar18 = (Matrix4x4 *)((long)pMVar18 + ((ulong)bVar21 * -2 + 1) * 8);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      if (local_238[0] != local_228) {
        operator_delete(local_238[0]);
      }
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)local_480);
      if (iVar6 == 0) {
        local_508.entries[3].z = 0.0;
        local_508.entries[3].w = 0.0;
        local_508.entries[3].x = 0.0;
        local_508.entries[3].y = 0.0;
        local_508.entries[2].z = 0.0;
        local_508.entries[2].w = 0.0;
        local_508.entries[2].x = 0.0;
        local_508.entries[2].y = 0.0;
        local_508.entries[1].z = 0.0;
        local_508.entries[1].w = 0.0;
        local_508.entries[1].x = 0.0;
        local_508.entries[1].y = 0.0;
        local_508.entries[0].z = 0.0;
        local_508.entries[0].w = 0.0;
        local_508.entries[0].x = 0.0;
        local_508.entries[0].y = 0.0;
        pcVar7 = tinyxml2::XMLElement::GetText(pXVar8);
        std::__cxx11::string::string((string *)local_528,pcVar7,(allocator *)local_1b8);
        std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_528,_S_out|_S_in);
        pcVar7 = tinyxml2::XMLElement::Attribute(pXVar8,"sid",(char *)0x0);
        std::__cxx11::string::string((string *)&local_460,pcVar7,(allocator *)local_238);
        cVar1 = local_460[local_458 + -1];
        if (cVar1 == 'X') {
          Matrix4x4::operator()(&local_508,1,1);
          std::istream::_M_extract<double>((double *)local_1b8);
          Matrix4x4::operator()(&local_508,1,2);
          std::istream::_M_extract<double>((double *)local_1b8);
          iVar6 = 1;
          i = 2;
LAB_0016562e:
          Matrix4x4::operator()(&local_508,i,iVar6);
          iVar6 = 2;
          std::istream::_M_extract<double>((double *)local_1b8);
LAB_00165646:
          Matrix4x4::operator()(&local_508,iVar6,iVar6);
          std::istream::_M_extract<double>((double *)local_1b8);
        }
        else {
          if (cVar1 == 'Y') {
            Matrix4x4::operator()(&local_508,0,0);
            std::istream::_M_extract<double>((double *)local_1b8);
            Matrix4x4::operator()(&local_508,2,0);
            std::istream::_M_extract<double>((double *)local_1b8);
            iVar6 = 2;
            i = 0;
            goto LAB_0016562e;
          }
          if (cVar1 == 'Z') {
            Matrix4x4::operator()(&local_508,0,0);
            std::istream::_M_extract<double>((double *)local_1b8);
            Matrix4x4::operator()(&local_508,0,1);
            std::istream::_M_extract<double>((double *)local_1b8);
            Matrix4x4::operator()(&local_508,1,0);
            iVar6 = 1;
            std::istream::_M_extract<double>((double *)local_1b8);
            goto LAB_00165646;
          }
        }
        Matrix4x4::operator*((Matrix4x4 *)local_238,&local_508,pMVar16);
        psVar14 = (string *)local_238;
        pMVar15 = pMVar16;
        for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
          pMVar15->entries[0].x = *(double *)psVar14;
          psVar14 = psVar14 + (ulong)bVar21 * -0x10 + 8;
          pMVar15 = (Matrix4x4 *)((long)pMVar15 + ((ulong)bVar21 * -2 + 1) * 8);
        }
        if (local_460 != local_450) {
          operator_delete(local_460);
        }
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        if (local_528[0] != local_518) {
          operator_delete(local_528[0]);
        }
      }
      iVar6 = std::__cxx11::string::compare((char *)local_480);
      if (iVar6 == 0) {
        local_508.entries[3].z = 0.0;
        local_508.entries[3].w = 0.0;
        local_508.entries[3].x = 0.0;
        local_508.entries[3].y = 0.0;
        local_508.entries[2].z = 0.0;
        local_508.entries[2].w = 0.0;
        local_508.entries[2].x = 0.0;
        local_508.entries[2].y = 0.0;
        local_508.entries[1].z = 0.0;
        local_508.entries[1].w = 0.0;
        local_508.entries[1].x = 0.0;
        local_508.entries[1].y = 0.0;
        local_508.entries[0].z = 0.0;
        local_508.entries[0].w = 0.0;
        local_508.entries[0].x = 0.0;
        local_508.entries[0].y = 0.0;
        pcVar7 = tinyxml2::XMLElement::GetText(pXVar8);
        std::__cxx11::string::string((string *)local_528,pcVar7,(allocator *)local_1b8);
        std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_528,_S_out|_S_in);
        Matrix4x4::operator()(&local_508,0,3);
        std::istream::_M_extract<double>((double *)local_1b8);
        Matrix4x4::operator()(&local_508,1,3);
        std::istream::_M_extract<double>((double *)local_1b8);
        Matrix4x4::operator()(&local_508,2,3);
        std::istream::_M_extract<double>((double *)local_1b8);
        Matrix4x4::operator*((Matrix4x4 *)local_238,&local_508,pMVar16);
        psVar14 = (string *)local_238;
        pMVar15 = pMVar16;
        for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
          pMVar15->entries[0].x = *(double *)psVar14;
          psVar14 = psVar14 + (ulong)bVar21 * -0x10 + 8;
          pMVar15 = (Matrix4x4 *)((long)pMVar15 + ((ulong)bVar21 * -2 + 1) * 8);
        }
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        if (local_528[0] != local_518) {
          operator_delete(local_528[0]);
        }
      }
      iVar6 = std::__cxx11::string::compare((char *)local_480);
      if (iVar6 == 0) {
        local_508.entries[3].z = 0.0;
        local_508.entries[3].w = 0.0;
        local_508.entries[3].x = 0.0;
        local_508.entries[3].y = 0.0;
        local_508.entries[2].z = 0.0;
        local_508.entries[2].w = 0.0;
        local_508.entries[2].x = 0.0;
        local_508.entries[2].y = 0.0;
        local_508.entries[1].z = 0.0;
        local_508.entries[1].w = 0.0;
        local_508.entries[1].x = 0.0;
        local_508.entries[1].y = 0.0;
        local_508.entries[0].z = 0.0;
        local_508.entries[0].w = 0.0;
        local_508.entries[0].x = 0.0;
        local_508.entries[0].y = 0.0;
        pcVar7 = tinyxml2::XMLElement::GetText(pXVar8);
        std::__cxx11::string::string((string *)local_528,pcVar7,(allocator *)local_1b8);
        std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_528,_S_out|_S_in);
        Matrix4x4::operator()(&local_508,0,0);
        std::istream::_M_extract<double>((double *)local_1b8);
        Matrix4x4::operator()(&local_508,1,1);
        std::istream::_M_extract<double>((double *)local_1b8);
        Matrix4x4::operator()(&local_508,1,1);
        std::istream::_M_extract<double>((double *)local_1b8);
        Matrix4x4::operator*((Matrix4x4 *)local_238,&local_508,pMVar16);
        psVar14 = (string *)local_238;
        pMVar15 = pMVar16;
        for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
          pMVar15->entries[0].x = *(double *)psVar14;
          psVar14 = psVar14 + (ulong)bVar21 * -0x10 + 8;
          pMVar15 = (Matrix4x4 *)((long)pMVar15 + ((ulong)bVar21 * -2 + 1) * 8);
        }
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        if (local_528[0] != local_518) {
          operator_delete(local_528[0]);
        }
      }
      pXVar8 = tinyxml2::XMLNode::NextSiblingElement(&pXVar8->super_XMLNode,(char *)0x0);
    }
    if (local_480[0] != local_470) {
      operator_delete(local_480[0]);
    }
  } while (iVar5 != 0);
  lVar13 = 0x10;
  do {
    uVar2 = *(undefined8 *)(up + lVar13 + 0x10);
    uVar3 = *(undefined8 *)((long)&transform + lVar13);
    uVar4 = *(undefined8 *)((long)&DAT_00268cd0 + lVar13);
    *(undefined8 *)((long)auStack_1c8 + lVar13) = *(undefined8 *)(up + lVar13 + 8);
    *(undefined8 *)((long)auStack_1c8 + lVar13 + 8) = uVar2;
    *(undefined8 *)((long)auStack_1b0 + lVar13 + -8) = uVar3;
    *(undefined8 *)((long)auStack_1b0 + lVar13) = uVar4;
    lVar13 = lVar13 + 0x20;
  } while (lVar13 != 0x90);
  pMVar16 = &local_300.transform;
  Matrix4x4::operator*(&local_508,(Matrix4x4 *)&transform,pMVar16);
  pXVar8 = local_488;
  pMVar15 = &local_508;
  pMVar18 = pMVar16;
  for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
    pMVar18->entries[0].x = pMVar15->entries[0].x;
    pMVar15 = (Matrix4x4 *)((long)pMVar15 + ((ulong)bVar21 * -2 + 1) * 8);
    pMVar18 = (Matrix4x4 *)((long)pMVar18 + ((ulong)bVar21 * -2 + 1) * 8);
  }
  pdVar19 = (double *)&transform;
  for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
    *pdVar19 = pMVar16->entries[0].x;
    pMVar16 = (Matrix4x4 *)((long)pMVar16 + ((ulong)bVar21 * -2 + 1) * 8);
    pdVar19 = pdVar19 + (ulong)bVar21 * -2 + 1;
  }
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"node","");
  pXVar9 = get_element(pXVar8,&local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p);
  }
  for (; pXVar9 != (XMLElement *)0x0;
      pXVar9 = tinyxml2::XMLNode::NextSiblingElement(&pXVar9->super_XMLNode,"node")) {
    parse_node(pXVar9);
  }
  psVar17 = local_1b8;
  puVar20 = &transform;
  for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
    *puVar20 = *(undefined8 *)psVar17;
    psVar17 = psVar17 + ((ulong)bVar21 * -2 + 1) * 8;
    puVar20 = puVar20 + (ulong)bVar21 * -2 + 1;
  }
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"instance_camera","");
  pXVar9 = get_element(pXVar8,&local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p);
  }
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"instance_light","");
  xml_00 = get_element(pXVar8,&local_360);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"instance_geometry","");
  xml_01 = get_element(pXVar8,&local_380);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p);
  }
  if (pXVar9 == (XMLElement *)0x0) {
    if (xml_00 == (XMLElement *)0x0) {
      if (xml_01 != (XMLElement *)0x0) {
        local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"mesh","");
        pXVar9 = get_element(xml_01,&local_3a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
          operator_delete(local_3a0._M_dataplus._M_p);
        }
        if (pXVar9 == (XMLElement *)0x0) {
          local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"extra","");
          pXVar9 = get_element(xml_01,&local_400);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_400._M_dataplus._M_p != &local_400.field_2) {
            operator_delete(local_400._M_dataplus._M_p);
          }
          if (pXVar9 == (XMLElement *)0x0) goto LAB_00165bbf;
          pLVar10 = (LightInfo *)operator_new(0x58);
          *(undefined8 *)&pLVar10->super_Instance = 0;
          (pLVar10->super_Instance).id._M_dataplus._M_p = (pointer)0x0;
          (pLVar10->super_Instance).id._M_string_length = 0;
          (pLVar10->super_Instance).id.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(pLVar10->super_Instance).id.field_2 + 8) = 0;
          (pLVar10->super_Instance).name._M_dataplus._M_p = (pointer)0x0;
          (pLVar10->super_Instance).name._M_string_length = 0;
          (pLVar10->super_Instance).name.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(pLVar10->super_Instance).name.field_2 + 8) = 0;
          ((Vector3D *)&pLVar10->light_type)->x = 0.0;
          *(double *)&(pLVar10->spectrum).g = 0.0;
          (pLVar10->super_Instance).id._M_dataplus._M_p =
               (pointer)&(pLVar10->super_Instance).id.field_2;
          (pLVar10->super_Instance).id._M_string_length = 0;
          (pLVar10->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (pLVar10->super_Instance).name._M_dataplus._M_p =
               (pointer)&(pLVar10->super_Instance).name.field_2;
          (pLVar10->super_Instance).name._M_string_length = 0;
          (pLVar10->super_Instance).name.field_2._M_local_buf[0] = '\0';
          parse_sphere(xml_01,(SphereInfo *)pLVar10);
          local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_420,
                     "instance_geometry/bind_material/technique_common/instance_material","");
          pXVar8 = get_element(pXVar8,&local_420);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_420._M_dataplus._M_p != &local_420.field_2) {
            operator_delete(local_420._M_dataplus._M_p);
          }
          local_300.instance = (Instance *)pLVar10;
          if (pXVar8 == (XMLElement *)0x0) goto LAB_00165bbf;
          pcVar7 = tinyxml2::XMLElement::Attribute(pXVar8,"target",(char *)0x0);
          if (pcVar7 == (char *)0x0) goto LAB_00166051;
          pcVar7 = tinyxml2::XMLElement::Attribute(pXVar8,"target",(char *)0x0);
          local_508.entries[0].x = (double)&local_508.entries[0].z;
          sVar11 = strlen(pcVar7 + 1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_508,pcVar7 + 1,pcVar7 + sVar11 + 1);
          local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_440,local_508.entries[0].x,
                     (long)local_508.entries[0].y + (long)local_508.entries[0].x);
          pXVar8 = uri_find(&local_440);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) {
            operator_delete(local_440._M_dataplus._M_p);
          }
          if (pXVar8 == (XMLElement *)0x0) goto LAB_00166051;
          pMVar12 = (MaterialInfo *)operator_new(0x50);
          *(undefined8 *)&pMVar12->super_Instance = 0;
          (pMVar12->super_Instance).id._M_dataplus._M_p = (pointer)0x0;
          (pMVar12->super_Instance).id._M_string_length = 0;
          (pMVar12->super_Instance).id.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(pMVar12->super_Instance).id.field_2 + 8) = 0;
          (pMVar12->super_Instance).name._M_dataplus._M_p = (pointer)0x0;
          (pMVar12->super_Instance).name._M_string_length = 0;
          (pMVar12->super_Instance).name.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(pMVar12->super_Instance).name.field_2 + 8) = 0;
          pMVar12->bsdf = (BSDF *)0x0;
          (pMVar12->super_Instance).id._M_dataplus._M_p =
               (pointer)&(pMVar12->super_Instance).id.field_2;
          (pMVar12->super_Instance).id._M_string_length = 0;
          (pMVar12->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (pMVar12->super_Instance).name._M_dataplus._M_p =
               (pointer)&(pMVar12->super_Instance).name.field_2;
          (pMVar12->super_Instance).name._M_string_length = 0;
          (pMVar12->super_Instance).name.field_2._M_local_buf[0] = '\0';
          parse_material(pXVar8,pMVar12);
          *(MaterialInfo **)&(pLVar10->spectrum).g = pMVar12;
        }
        else {
          pLVar10 = (LightInfo *)operator_new(0xb0);
          memset(pLVar10,0,0xb0);
          (pLVar10->super_Instance).id._M_dataplus._M_p =
               (pointer)&(pLVar10->super_Instance).id.field_2;
          (pLVar10->super_Instance).id._M_string_length = 0;
          (pLVar10->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (pLVar10->super_Instance).name._M_dataplus._M_p =
               (pointer)&(pLVar10->super_Instance).name.field_2;
          (pLVar10->super_Instance).name._M_string_length = 0;
          (pLVar10->super_Instance).name.field_2._M_local_buf[0] = '\0';
          pLVar10->light_type = NONE;
          (pLVar10->spectrum).r = 0.0;
          (pLVar10->spectrum).g = 0.0;
          (pLVar10->spectrum).b = 0.0;
          (pLVar10->position).x = 0.0;
          (pLVar10->position).y = 0.0;
          (pLVar10->position).z = 0.0;
          (pLVar10->direction).x = 0.0;
          (pLVar10->direction).y = 0.0;
          (pLVar10->direction).z = 0.0;
          (pLVar10->up).x = 0.0;
          (pLVar10->up).y = 0.0;
          (pLVar10->up).z = 0.0;
          pLVar10->falloff_deg = 0.0;
          pLVar10->falloff_exp = 0.0;
          parse_polymesh(xml_01,(PolymeshInfo *)pLVar10);
          local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3c0,
                     "instance_geometry/bind_material/technique_common/instance_material","");
          pXVar8 = get_element(pXVar8,&local_3c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            operator_delete(local_3c0._M_dataplus._M_p);
          }
          local_300.instance = (Instance *)pLVar10;
          if (pXVar8 == (XMLElement *)0x0) goto LAB_00165bbf;
          pcVar7 = tinyxml2::XMLElement::Attribute(pXVar8,"target",(char *)0x0);
          if (pcVar7 == (char *)0x0) {
LAB_00166051:
            exit(1);
          }
          pcVar7 = tinyxml2::XMLElement::Attribute(pXVar8,"target",(char *)0x0);
          local_508.entries[0].x = (double)&local_508.entries[0].z;
          sVar11 = strlen(pcVar7 + 1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_508,pcVar7 + 1,pcVar7 + sVar11 + 1);
          local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3e0,local_508.entries[0].x,
                     (long)local_508.entries[0].y + (long)local_508.entries[0].x);
          pXVar8 = uri_find(&local_3e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
            operator_delete(local_3e0._M_dataplus._M_p);
          }
          if (pXVar8 == (XMLElement *)0x0) goto LAB_00166051;
          pMVar12 = (MaterialInfo *)operator_new(0x50);
          *(undefined8 *)&pMVar12->super_Instance = 0;
          (pMVar12->super_Instance).id._M_dataplus._M_p = (pointer)0x0;
          (pMVar12->super_Instance).id._M_string_length = 0;
          (pMVar12->super_Instance).id.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(pMVar12->super_Instance).id.field_2 + 8) = 0;
          (pMVar12->super_Instance).name._M_dataplus._M_p = (pointer)0x0;
          (pMVar12->super_Instance).name._M_string_length = 0;
          (pMVar12->super_Instance).name.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(pMVar12->super_Instance).name.field_2 + 8) = 0;
          pMVar12->bsdf = (BSDF *)0x0;
          (pMVar12->super_Instance).id._M_dataplus._M_p =
               (pointer)&(pMVar12->super_Instance).id.field_2;
          (pMVar12->super_Instance).id._M_string_length = 0;
          (pMVar12->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (pMVar12->super_Instance).name._M_dataplus._M_p =
               (pointer)&(pMVar12->super_Instance).name.field_2;
          (pMVar12->super_Instance).name._M_string_length = 0;
          (pMVar12->super_Instance).name.field_2._M_local_buf[0] = '\0';
          parse_material(pXVar8,pMVar12);
          *(MaterialInfo **)&pLVar10->constant_att = pMVar12;
        }
        local_300.instance = &pLVar10->super_Instance;
        if ((double *)local_508.entries[0].x != &local_508.entries[0].z) {
          operator_delete((void *)local_508.entries[0].x);
        }
      }
    }
    else {
      pLVar10 = (LightInfo *)operator_new(0xb8);
      LightInfo::LightInfo(pLVar10);
      parse_light(xml_00,pLVar10);
      local_300.instance = (Instance *)pLVar10;
    }
  }
  else {
    pLVar10 = (LightInfo *)operator_new(0x88);
    memset(pLVar10,0,0x88);
    (pLVar10->super_Instance).id._M_dataplus._M_p = (pointer)&(pLVar10->super_Instance).id.field_2;
    (pLVar10->super_Instance).id._M_string_length = 0;
    (pLVar10->super_Instance).id.field_2._M_local_buf[0] = '\0';
    (pLVar10->super_Instance).name._M_dataplus._M_p =
         (pointer)&(pLVar10->super_Instance).name.field_2;
    (pLVar10->super_Instance).name._M_string_length = 0;
    (pLVar10->super_Instance).name.field_2._M_local_buf[0] = '\0';
    ((Vector3D *)&pLVar10->light_type)->x = 0.0;
    *(double *)&(pLVar10->spectrum).g = 0.0;
    (pLVar10->position).x = 0.0;
    (pLVar10->position).y = 0.0;
    (pLVar10->position).z = 0.0;
    (pLVar10->direction).x = 0.0;
    parse_camera(pXVar9,(CameraInfo *)pLVar10);
    local_300.instance = (Instance *)pLVar10;
  }
LAB_00165bbf:
  std::vector<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>::push_back
            (scene,&local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300.name._M_dataplus._M_p != &local_300.name.field_2) {
    operator_delete(local_300.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300.id._M_dataplus._M_p != &local_300.id.field_2) {
    operator_delete(local_300.id._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ColladaParser::parse_node(XMLElement* xml) {
  // create new node
  Node node = Node();

  // name & id
  node.id = xml->Attribute("id");
  node.name = xml->Attribute("name");
  stat(" |- Node: " << node.name << " (id:" << node.id << ")");

  // node transformation -
  // combine in order of declaration if the transformations are given as a
  // transformation list
  XMLElement* e = xml->FirstChildElement();
  while (e) {
    string name = e->Name();

    // transformation - matrix
    if (name == "matrix") {
      string s = e->GetText();
      stringstream ss(s);

      Matrix4x4 mat;
      ss >> mat(0, 0);
      ss >> mat(0, 1);
      ss >> mat(0, 2);
      ss >> mat(0, 3);
      ss >> mat(1, 0);
      ss >> mat(1, 1);
      ss >> mat(1, 2);
      ss >> mat(1, 3);
      ss >> mat(2, 0);
      ss >> mat(2, 1);
      ss >> mat(2, 2);
      ss >> mat(2, 3);
      ss >> mat(3, 0);
      ss >> mat(3, 1);
      ss >> mat(3, 2);
      ss >> mat(3, 3);

      node.transform = mat;
      break;
    }

    // transformation - rotate
    if (name == "rotate") {
      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss(s);

      string sid = e->Attribute("sid");
      switch (sid.back()) {
        case 'X':
          ss >> m(1, 1);
          ss >> m(1, 2);
          ss >> m(2, 1);
          ss >> m(2, 2);
          break;
        case 'Y':
          ss >> m(0, 0);
          ss >> m(2, 0);
          ss >> m(0, 2);
          ss >> m(2, 2);
          break;
        case 'Z':
          ss >> m(0, 0);
          ss >> m(0, 1);
          ss >> m(1, 0);
          ss >> m(1, 1);
          break;
        default:
          break;
      }

      node.transform = m * node.transform;
    }

    // transformation - translate
    if (name == "translate") {
      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss(s);

      ss >> m(0, 3);
      ss >> m(1, 3);
      ss >> m(2, 3);

      node.transform = m * node.transform;
    }

    // transformation - scale
    if (name == "scale") {
      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss(s);

      ss >> m(0, 0);
      ss >> m(1, 1);
      ss >> m(1, 1);

      node.transform = m * node.transform;
    }

    // transformation - skew
    // Note (sky): ignored for now

    // transformation - lookat
    // Note (sky): ignored for now

    e = e->NextSiblingElement();
  }

  // push transformations
  Matrix4x4 transform_save = transform;

  // combine transformations
  node.transform = transform * node.transform;
  transform = node.transform;

  // parse child nodes if node is a joint
  XMLElement* e_child = get_element(xml, "node");
  while (e_child) {
    parse_node(e_child);
    e_child = e_child->NextSiblingElement("node");
  }

  // pop transformations
  transform = transform_save;

  // node instance -
  // non-joint nodes must contain a scene object instance
  XMLElement* e_camera = get_element(xml, "instance_camera");
  XMLElement* e_light = get_element(xml, "instance_light");
  XMLElement* e_geometry = get_element(xml, "instance_geometry");

  if (e_camera) {
    CameraInfo* camera = new CameraInfo();
    parse_camera(e_camera, *camera);
    node.instance = camera;
  } else if (e_light) {
    LightInfo* light = new LightInfo();
    parse_light(e_light, *light);
    node.instance = light;
  } else if (e_geometry) {
    if (get_element(e_geometry, "mesh")) {
      // mesh geometry
      PolymeshInfo* polymesh = new PolymeshInfo();
      parse_polymesh(e_geometry, *polymesh);

      // mesh material
      XMLElement* e_instance_material = get_element(
          xml,
          "instance_geometry/bind_material/technique_common/instance_material");
      if (e_instance_material) {
        if (!e_instance_material->Attribute("target")) {
          stat(
              "Error: no target material in instance: " << e_instance_material);
          exit(EXIT_FAILURE);
        }

        string material_id = e_instance_material->Attribute("target") + 1;
        XMLElement* e_material = uri_find(material_id);
        if (!e_material) {
          stat("Error: invalid target material id : " << material_id);
          exit(EXIT_FAILURE);
        }

        MaterialInfo* material = new MaterialInfo();
        parse_material(e_material, *material);
        polymesh->material = material;
      }

      node.instance = polymesh;

    } else if (get_element(e_geometry, "extra")) {
      // sphere geometry
      SphereInfo* sphere = new SphereInfo();
      parse_sphere(e_geometry, *sphere);

      // sphere material
      XMLElement* e_instance_material = get_element(
          xml,
          "instance_geometry/bind_material/technique_common/instance_material");
      if (e_instance_material) {
        if (!e_instance_material->Attribute("target")) {
          stat(
              "Error: no target material in instance: " << e_instance_material);
          exit(EXIT_FAILURE);
        }

        string material_id = e_instance_material->Attribute("target") + 1;
        XMLElement* e_material = uri_find(material_id);
        if (!e_material) {
          stat("Error: invalid target material id : " << material_id);
          exit(EXIT_FAILURE);
        }

        MaterialInfo* material = new MaterialInfo();
        parse_material(e_material, *material);
        sphere->material = material;
      }

      node.instance = sphere;
    }
  }

  // add node to scene
  scene->nodes.push_back(node);
}